

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O0

int nn_surveyor_events(nn_sockbase *self)

{
  int iVar1;
  undefined8 local_28;
  nn_surveyor *surveyor;
  int rc;
  nn_sockbase *self_local;
  
  local_28 = (nn_surveyor *)self;
  if (self == (nn_sockbase *)0x0) {
    local_28 = (nn_surveyor *)0x0;
  }
  surveyor._4_4_ = nn_xsurveyor_events((nn_sockbase *)local_28);
  iVar1 = nn_surveyor_inprogress(local_28);
  if (iVar1 == 0) {
    surveyor._4_4_ = surveyor._4_4_ | 1;
  }
  return surveyor._4_4_;
}

Assistant:

static int nn_surveyor_events (struct nn_sockbase *self)
{
    int rc;
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    /*  Determine the actual readability/writability of the socket. */
    rc = nn_xsurveyor_events (&surveyor->xsurveyor.sockbase);

    /*  If there's no survey going on we'll signal IN to interrupt polling
        when the survey expires. nn_recv() will return -EFSM afterwards. */
    if (!nn_surveyor_inprogress (surveyor))
        rc |= NN_SOCKBASE_EVENT_IN;

    return rc;
}